

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

char * cs_strerror(cs_err code)

{
  char *pcStack_10;
  cs_err code_local;
  
  switch(code) {
  case CS_ERR_OK:
    pcStack_10 = "OK (CS_ERR_OK)";
    break;
  case CS_ERR_MEM:
    pcStack_10 = "Out of memory (CS_ERR_MEM)";
    break;
  case CS_ERR_ARCH:
    pcStack_10 = "Invalid architecture (CS_ERR_ARCH)";
    break;
  case CS_ERR_HANDLE:
    pcStack_10 = "Invalid handle (CS_ERR_HANDLE)";
    break;
  case CS_ERR_CSH:
    pcStack_10 = "Invalid csh (CS_ERR_CSH)";
    break;
  case CS_ERR_MODE:
    pcStack_10 = "Invalid mode (CS_ERR_MODE)";
    break;
  case CS_ERR_OPTION:
    pcStack_10 = "Invalid option (CS_ERR_OPTION)";
    break;
  case CS_ERR_DETAIL:
    pcStack_10 = "Details are unavailable (CS_ERR_DETAIL)";
    break;
  case CS_ERR_MEMSETUP:
    pcStack_10 = "Dynamic memory management uninitialized (CS_ERR_MEMSETUP)";
    break;
  case CS_ERR_VERSION:
    pcStack_10 = "Different API version between core & binding (CS_ERR_VERSION)";
    break;
  case CS_ERR_DIET:
    pcStack_10 = "Information irrelevant in diet engine (CS_ERR_DIET)";
    break;
  case CS_ERR_SKIPDATA:
    pcStack_10 = 
    "Information irrelevant for \'data\' instruction in SKIPDATA mode (CS_ERR_SKIPDATA)";
    break;
  default:
    pcStack_10 = "Unknown error code";
  }
  return pcStack_10;
}

Assistant:

CAPSTONE_EXPORT
const char *cs_strerror(cs_err code)
{
	switch(code) {
		default:
			return "Unknown error code";
		case CS_ERR_OK:
			return "OK (CS_ERR_OK)";
		case CS_ERR_MEM:
			return "Out of memory (CS_ERR_MEM)";
		case CS_ERR_ARCH:
			return "Invalid architecture (CS_ERR_ARCH)";
		case CS_ERR_HANDLE:
			return "Invalid handle (CS_ERR_HANDLE)";
		case CS_ERR_CSH:
			return "Invalid csh (CS_ERR_CSH)";
		case CS_ERR_MODE:
			return "Invalid mode (CS_ERR_MODE)";
		case CS_ERR_OPTION:
			return "Invalid option (CS_ERR_OPTION)";
		case CS_ERR_DETAIL:
			return "Details are unavailable (CS_ERR_DETAIL)";
		case CS_ERR_MEMSETUP:
			return "Dynamic memory management uninitialized (CS_ERR_MEMSETUP)";
		case CS_ERR_VERSION:
			return "Different API version between core & binding (CS_ERR_VERSION)";
		case CS_ERR_DIET:
			return "Information irrelevant in diet engine (CS_ERR_DIET)";
		case CS_ERR_SKIPDATA:
			return "Information irrelevant for 'data' instruction in SKIPDATA mode (CS_ERR_SKIPDATA)";
	}
}